

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataPdu.cpp
# Opt level: O1

bool __thiscall DIS::DataPdu::operator==(DataPdu *this,DataPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  pointer pFVar3;
  pointer pVVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar1 = this->_padding1 == rhs->_padding1 && (this->_requestID == rhs->_requestID && bVar1);
  pFVar3 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = FixedDatum::operator==
                        ((FixedDatum *)((long)&pFVar3->_vptr_FixedDatum + lVar5),
                         (FixedDatum *)
                         ((long)&((rhs->_fixedDatums).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                         lVar5));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pFVar3 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_fixedDatums).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4));
  }
  pVVar4 = (this->_variableDatums).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatums).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar4->_vptr_VariableDatum + lVar5),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatums).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar5));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pVVar4 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 < (ulong)(((long)(this->_variableDatums).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4)
                            * -0x5555555555555555));
  }
  return bVar1;
}

Assistant:

bool DataPdu::operator ==(const DataPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }